

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_RKCoeffs(MRIStepCoupling MRIC,int is,int *stage_map,realtype *Ae_row,realtype *Ai_row)

{
  uint uVar1;
  realtype ***ppprVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  iVar3 = -0x29;
  if ((((0 < is) && (Ai_row != (realtype *)0x0)) && (Ae_row != (realtype *)0x0)) &&
     ((stage_map != (int *)0x0 && (uVar1 = MRIC->stages, is < (int)uVar1)))) {
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      Ae_row[uVar4] = 0.0;
      Ai_row[uVar4] = 0.0;
    }
    uVar4 = (ulong)(uint)is;
    iVar3 = 0;
    uVar1 = MRIC->nmat;
    if (MRIC->nmat < 1) {
      uVar1 = 0;
    }
    uVar6 = 0;
    while (uVar5 = uVar6, uVar5 != uVar1) {
      uVar6 = uVar5 + 1;
      dVar9 = 1.0 / (double)(int)uVar6;
      ppprVar2 = MRIC->W;
      if (ppprVar2 != (realtype ***)0x0) {
        for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
          lVar7 = (long)stage_map[uVar8];
          if (-1 < lVar7) {
            Ae_row[lVar7] = ppprVar2[uVar5][uVar4][uVar8] * dVar9 + Ae_row[lVar7];
          }
        }
      }
      ppprVar2 = MRIC->G;
      if (ppprVar2 != (realtype ***)0x0) {
        for (uVar8 = 0; is + 1 != uVar8; uVar8 = uVar8 + 1) {
          lVar7 = (long)stage_map[uVar8];
          if (-1 < lVar7) {
            Ai_row[lVar7] = ppprVar2[uVar5][uVar4][uVar8] * dVar9 + Ai_row[lVar7];
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int mriStep_RKCoeffs(MRIStepCoupling MRIC, int is, int *stage_map,
                     realtype *Ae_row, realtype *Ai_row)
{
  int j, k;
  realtype kconst;

  if (is < 1 || is >= MRIC->stages || !stage_map || !Ae_row || !Ai_row)
    return ARK_INVALID_TABLE;

  /* initialize RK coefficient array */
  for (j = 0; j < MRIC->stages; j++) {
    Ae_row[j] = ZERO;
    Ai_row[j] = ZERO;
  }

  /* compute RK coefficients */
  for (k = 0; k < MRIC->nmat; k++) {
    kconst = ONE/(k+ONE);
    if (MRIC->W) {
      for (j = 0; j < is; j++)
        if (stage_map[j] > -1)
          Ae_row[stage_map[j]] += (MRIC->W[k][is][j] * kconst);
    }
    if (MRIC->G) {
      for (j = 0; j <= is; j++)
        if (stage_map[j] > -1)
          Ai_row[stage_map[j]] += (MRIC->G[k][is][j] * kconst);
    }
  }

  return(ARK_SUCCESS);
}